

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O0

void __thiscall Scene::Scene(Scene *this)

{
  Scene *this_local;
  
  this->_vptr_Scene = (_func_int **)&PTR__Scene_00110aa8;
  std::vector<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>::vector
            (&this->light);
  std::vector<std::shared_ptr<GeometricObject>,_std::allocator<std::shared_ptr<GeometricObject>_>_>
  ::vector(&this->solid);
  std::shared_ptr<Fog>::shared_ptr(&this->envFog);
  Vector::Vector(&this->eye,0.0,0.0,0.0);
  Vector::Vector(&this->eye_dir,0.0,0.0,1.0);
  Vector::Vector(&this->view_x,1.0,0.0,0.0);
  Vector::Vector(&this->view_y,0.0,1.0,0.0);
  this->aperture = 0.0;
  this->focus = 0.0;
  Vector::Vector(&this->ambient,1.0);
  Vector::Vector(&this->background,0.0,0.05,0.05);
  return;
}

Assistant:

Scene() {}